

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibrary::EnsureIntlObjectReady(JavascriptLibrary *this)

{
  code *pcVar1;
  bool bVar2;
  DynamicObject **ppDVar3;
  undefined4 *puVar4;
  DynamicObject *this_00;
  DynamicTypeHandler *pDVar5;
  JavascriptException *err;
  JavascriptExceptionObject *caughtExceptionObject;
  JavascriptLibrary *this_local;
  
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).IntlObject);
  if (*ppDVar3 == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x14a3,"(this->IntlObject != nullptr)",
                                "this->IntlObject != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = Memory::WriteBarrierPtr<Js::DynamicObject>::operator->
                      (&(this->super_JavascriptLibraryBase).IntlObject);
  pDVar5 = DynamicObject::GetTypeHandler(this_00);
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).IntlObject);
  (*pDVar5->_vptr_DynamicTypeHandler[0x10])(pDVar5,*ppDVar3);
  return;
}

Assistant:

void JavascriptLibrary::EnsureIntlObjectReady()
    {
        Assert(this->IntlObject != nullptr);

        // For Intl builtins, we need to make sure the Intl object has been initialized before fetching the
        // builtins from the EngineInterfaceObject. This is because the builtins are actually created via
        // Intl.js and are registered into the EngineInterfaceObject as part of Intl object initialization.
        JavascriptExceptionObject * caughtExceptionObject = nullptr;
        try
        {
            this->IntlObject->GetTypeHandler()->EnsureObjectReady(this->IntlObject);
        }
        catch (const JavascriptException& err)
        {
            caughtExceptionObject = err.GetAndClear();
        }

        // Propagate the OOM and SOE exceptions only
        if (caughtExceptionObject != nullptr &&
            (caughtExceptionObject == ThreadContext::GetContextForCurrentThread()->GetPendingOOMErrorObject() ||
            caughtExceptionObject == ThreadContext::GetContextForCurrentThread()->GetPendingSOErrorObject()))
        {
            caughtExceptionObject = caughtExceptionObject->CloneIfStaticExceptionObject(scriptContext);
            JavascriptExceptionOperators::DoThrow(caughtExceptionObject, scriptContext);
        }
    }